

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

ArgList * __thiscall
CompilerContext::get_args
          (ArgList *__return_storage_ptr__,CompilerContext *this,Command *command,
          SyntaxTree *command_node)

{
  bool bVar1;
  size_t sVar2;
  broken_contract *this_00;
  __shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *arg_node;
  ArgVariant local_98;
  __normal_iterator<const_std::shared_ptr<SyntaxTree>_*,_std::vector<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>_>
  local_60;
  shared_ptr<SyntaxTree> *local_58;
  __normal_iterator<const_std::shared_ptr<SyntaxTree>_*,_std::vector<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>_>
  local_50;
  __normal_iterator<const_std::shared_ptr<SyntaxTree>_*,_std::vector<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>_>
  it;
  SyntaxTree *command_node_local;
  Command *command_local;
  CompilerContext *this_local;
  ArgList *args;
  
  sVar2 = SyntaxTree::child_count(command_node);
  if (sVar2 == 0) {
    this_00 = (broken_contract *)__cxa_allocate_exception(0x10);
    broken_contract::broken_contract
              (this_00,
               "Precondition failure at  /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/compiler.cpp(650): command_node.child_count() >= 1."
              );
    __cxa_throw(this_00,&broken_contract::typeinfo,broken_contract::~broken_contract);
  }
  it._M_current._3_1_ = 0;
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::vector(__return_storage_ptr__);
  sVar2 = SyntaxTree::child_count(command_node);
  std::
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  ::reserve(__return_storage_ptr__,sVar2 - 1);
  local_58 = (shared_ptr<SyntaxTree> *)SyntaxTree::begin(command_node);
  local_50 = std::
             next<__gnu_cxx::__normal_iterator<std::shared_ptr<SyntaxTree>const*,std::vector<std::shared_ptr<SyntaxTree>,std::allocator<std::shared_ptr<SyntaxTree>>>>>
                       ((__normal_iterator<const_std::shared_ptr<SyntaxTree>_*,_std::vector<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>_>
                         )local_58,1);
  while( true ) {
    local_60._M_current = (shared_ptr<SyntaxTree> *)SyntaxTree::end(command_node);
    bVar1 = __gnu_cxx::operator!=(&local_50,&local_60);
    if (!bVar1) break;
    this_01 = (__shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<SyntaxTree>_*,_std::vector<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>_>
              ::operator*(&local_50);
    arg_node = std::__shared_ptr_access<SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*(this_01);
    get_arg(&local_98,this,arg_node);
    std::
    vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
    ::
    emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
              ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                *)__return_storage_ptr__,&local_98);
    eggs::variants::
    variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
    ::~variant(&local_98);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<SyntaxTree>_*,_std::vector<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>_>
    ::operator++(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

auto CompilerContext::get_args(const Command& command, const SyntaxTree& command_node) -> ArgList
{
    Expects(command_node.child_count() >= 1); // command_name + [args...]

    ArgList args;
    args.reserve(command_node.child_count() - 1);

    for(auto it = std::next(command_node.begin()); it != command_node.end(); ++it)
        args.emplace_back( get_arg(**it) );

    return args;
}